

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O3

void __thiscall asmjit::v1_14::JitAllocator::JitAllocator(JitAllocator *this,CreateParams *params)

{
  JitAllocatorOptions JVar1;
  int iVar2;
  HardenedRuntimeInfo HVar3;
  Info IVar4;
  CreateParams *pCVar5;
  undefined1 *puVar6;
  undefined8 *puVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  long lVar13;
  
  IVar4 = VirtMem::info();
  pCVar5 = (CreateParams *)&JitAllocatorParams_none;
  if (params != (CreateParams *)0x0) {
    pCVar5 = params;
  }
  JVar1 = pCVar5->options;
  uVar9 = pCVar5->blockSize;
  uVar10 = pCVar5->granularity;
  uVar11 = pCVar5->fillPattern;
  lVar13 = (ulong)(JVar1 & kUseMultiplePools) + 1;
  uVar12 = uVar10;
  if ((uVar10 & uVar10 - 1) != 0) {
    uVar12 = 0x40;
  }
  if (0xc0 < uVar10 - 0x40) {
    uVar12 = 0x40;
  }
  puVar6 = (undefined1 *)malloc(lVar13 * 0x48 + 0x60);
  if ((Impl *)puVar6 == (Impl *)0x0) {
    puVar6 = JitAllocatorImpl_none;
  }
  else {
    if ((JVar1 >> 0x1c & 1) == 0) {
      uVar11 = 0xcccccccc;
    }
    uVar10 = uVar9;
    if ((uVar9 & uVar9 - 1) != 0) {
      uVar10 = IVar4.pageGranularity;
    }
    if (0xfff0000 < uVar9 - 0x10000) {
      uVar10 = IVar4.pageGranularity;
    }
    HVar3 = VirtMem::hardenedRuntimeInfo();
    ((Impl *)((long)puVar6 + 0x10))->options = kNone;
    ((Impl *)((long)puVar6 + 0x10))->blockSize = 0;
    ((Impl *)((long)puVar6 + 0x10))->granularity = 0;
    ((Impl *)((long)puVar6 + 0x10))->fillPattern = 0;
    ((Impl *)((long)puVar6 + 0x30))->options = kNone;
    ((Impl *)((long)puVar6 + 0x30))->blockSize = 0;
    ((Impl *)((long)puVar6 + 0x20))->options = kNone;
    ((Impl *)((long)puVar6 + 0x20))->blockSize = 0;
    ((Impl *)((long)puVar6 + 0x20))->granularity = 0;
    ((Impl *)((long)puVar6 + 0x20))->fillPattern = 0;
    ((Impl *)((long)puVar6 + 0x40))->options = kNone;
    ((Impl *)((long)puVar6 + 0x40))->blockSize = 0;
    ((Impl *)((long)puVar6 + 0x40))->granularity = 0;
    ((Impl *)((long)puVar6 + 0x40))->fillPattern = 0;
    *(Impl **)((long)puVar6 + 0x50) = (Impl *)((long)puVar6 + 0x60);
    *(long *)&((Impl *)((long)puVar6 + 0x50))->granularity = lVar13;
    ((Impl *)puVar6)->options = (HVar3.flags & (kMapJit|kEnabled)) == kEnabled | JVar1;
    ((Impl *)puVar6)->blockSize = uVar10;
    ((Impl *)puVar6)->granularity = uVar12;
    ((Impl *)puVar6)->fillPattern = uVar11;
    ((Impl *)((long)puVar6 + 0x30))->granularity = IVar4.pageSize;
    puVar7 = (undefined8 *)((long)&((Impl *)((long)puVar6 + 0x70))->fillPattern + 3);
    lVar8 = 0;
    do {
      uVar9 = uVar12 << ((byte)lVar8 & 0x1f);
      *(undefined8 *)((long)puVar7 + -0x13) = 0;
      *(undefined8 *)((long)puVar7 + -0xb) = 0;
      *(undefined8 *)((long)puVar7 + -0x1f) = 0;
      *(undefined8 *)((long)puVar7 + -0x17) = 0;
      *(short *)((long)puVar7 + -3) = (short)uVar9;
      iVar2 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
        }
      }
      *(char *)((long)puVar7 + -1) = (char)iVar2;
      *puVar7 = 0;
      puVar7[1] = 0;
      puVar7[2] = 0;
      puVar7[3] = 0;
      *(undefined8 *)((long)puVar7 + 0x19) = 0;
      *(undefined8 *)((long)puVar7 + 0x21) = 0;
      lVar8 = lVar8 + 1;
      puVar7 = puVar7 + 9;
    } while (lVar13 != lVar8);
  }
  this->_impl = (Impl *)puVar6;
  return;
}

Assistant:

JitAllocator::JitAllocator(const CreateParams* params) noexcept {
  _impl = JitAllocatorImpl_new(params);
  if (ASMJIT_UNLIKELY(!_impl))
    _impl = const_cast<JitAllocator::Impl*>(&JitAllocatorImpl_none);
}